

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O0

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkCompatibility
          (CompatibilityChecker *this,Reader *field,Reader *replacement)

{
  bool bVar1;
  uint16_t uVar2;
  Which WVar3;
  uint64_t uVar4;
  uint local_4c0;
  uint local_4b8;
  Fault local_4a0;
  Fault f_2;
  uint64_t local_468;
  Reader local_460;
  uint64_t local_430;
  DebugExpression<unsigned_long> local_428;
  undefined1 local_420 [8];
  DebugComparison<unsigned_long,_unsigned_long> _kjCondition_2;
  Maybe<capnp::schema::Node::Reader> local_3c0;
  Reader local_388;
  Reader local_358;
  Reader local_328;
  Maybe<capnp::schema::Field::Reader> local_2f8;
  Maybe<capnp::schema::Node::Reader> local_2c0;
  Reader local_288;
  Reader local_258;
  Fault local_228;
  Fault f_1;
  uint32_t local_218;
  DebugExpression<unsigned_int> local_214;
  undefined1 local_210 [8];
  DebugComparison<unsigned_int,_unsigned_int> _kjCondition_1;
  Reader local_1c0;
  Reader local_190;
  Reader local_160;
  undefined1 local_130 [8];
  Reader replacementSlot;
  Reader slot;
  Fault local_c8;
  Fault f;
  undefined1 local_b8 [8];
  DebugComparison<unsigned_int_&,_unsigned_int_&> _kjCondition;
  uint replacementDiscriminant;
  uint local_7c;
  undefined1 local_78 [4];
  uint discriminant;
  ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:801:5)>
  _kjContext801;
  anon_class_8_1_a7e8901a _kjContextFunc801;
  Reader *replacement_local;
  Reader *field_local;
  CompatibilityChecker *this_local;
  
  _kjContext801.func = (anon_class_8_1_a7e8901a *)field;
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:801:5)>
  ::ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:801:5)>
                 *)local_78,(anon_class_8_1_a7e8901a *)&_kjContext801.func);
  bVar1 = hasDiscriminantValue(field);
  if (bVar1) {
    uVar2 = capnp::schema::Field::Reader::getDiscriminantValue(field);
    local_4b8 = (uint)uVar2;
  }
  else {
    local_4b8 = 0;
  }
  local_7c = local_4b8;
  bVar1 = hasDiscriminantValue(replacement);
  if (bVar1) {
    uVar2 = capnp::schema::Field::Reader::getDiscriminantValue(replacement);
    local_4c0 = (uint)uVar2;
  }
  else {
    local_4c0 = 0;
  }
  _kjCondition._32_4_ = local_4c0;
  f.exception = (Exception *)
                kj::_::DebugExpressionStart::operator<<
                          ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_7c);
  kj::_::DebugExpression<unsigned_int&>::operator==
            ((DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_b8,
             (DebugExpression<unsigned_int&> *)&f,(uint *)&_kjCondition.result);
  bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_b8);
  if (bVar1) {
    WVar3 = capnp::schema::Field::Reader::which(field);
    if (WVar3 == SLOT) {
      capnp::schema::Field::Reader::getSlot((Reader *)&replacementSlot._reader.nestingLimit,field);
      WVar3 = capnp::schema::Field::Reader::which(replacement);
      if (WVar3 == SLOT) {
        capnp::schema::Field::Reader::getSlot((Reader *)local_130,replacement);
        capnp::schema::Field::Slot::Reader::getType
                  (&local_160,(Reader *)&replacementSlot._reader.nestingLimit);
        capnp::schema::Field::Slot::Reader::getType(&local_190,(Reader *)local_130);
        checkCompatibility(this,&local_160,&local_190,NO_UPGRADE_TO_STRUCT);
        capnp::schema::Field::Slot::Reader::getDefaultValue
                  (&local_1c0,(Reader *)&replacementSlot._reader.nestingLimit);
        capnp::schema::Field::Slot::Reader::getDefaultValue
                  ((Reader *)&_kjCondition_1.result,(Reader *)local_130);
        checkDefaultCompatibility(this,&local_1c0,(Reader *)&_kjCondition_1.result);
        local_218 = capnp::schema::Field::Slot::Reader::getOffset
                              ((Reader *)&replacementSlot._reader.nestingLimit);
        local_214 = kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_218);
        f_1.exception._4_4_ = capnp::schema::Field::Slot::Reader::getOffset((Reader *)local_130);
        kj::_::DebugExpression<unsigned_int>::operator==
                  ((DebugComparison<unsigned_int,_unsigned_int> *)local_210,&local_214,
                   (uint *)((long)&f_1.exception + 4));
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_210);
        if (!bVar1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,char_const(&)[23]>
                    (&local_228,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x338,FAILED,"slot.getOffset() == replacementSlot.getOffset()",
                     "_kjCondition,\"field position changed\"",
                     (DebugComparison<unsigned_int,_unsigned_int> *)local_210,
                     (char (*) [23])"field position changed");
          this->compatibility = INCOMPATIBLE;
          kj::_::Debug::Fault::~Fault(&local_228);
        }
      }
      else if (WVar3 == GROUP) {
        capnp::schema::Field::Slot::Reader::getType
                  (&local_258,(Reader *)&replacementSlot._reader.nestingLimit);
        capnp::schema::Field::Reader::getGroup(&local_288,replacement);
        uVar4 = capnp::schema::Field::Group::Reader::getTypeId(&local_288);
        kj::Maybe<capnp::schema::Node::Reader>::Maybe(&local_2c0,&this->existingNode);
        kj::Maybe<capnp::schema::Field::Reader>::Maybe(&local_2f8,field);
        checkUpgradeToStruct(this,&local_258,uVar4,&local_2c0,&local_2f8);
        kj::Maybe<capnp::schema::Field::Reader>::~Maybe(&local_2f8);
        kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&local_2c0);
      }
    }
    else if (WVar3 == GROUP) {
      WVar3 = capnp::schema::Field::Reader::which(replacement);
      if (WVar3 == SLOT) {
        capnp::schema::Field::Reader::getSlot(&local_358,replacement);
        capnp::schema::Field::Slot::Reader::getType(&local_328,&local_358);
        capnp::schema::Field::Reader::getGroup(&local_388,field);
        uVar4 = capnp::schema::Field::Group::Reader::getTypeId(&local_388);
        kj::Maybe<capnp::schema::Node::Reader>::Maybe(&local_3c0,&this->replacementNode);
        kj::Maybe<capnp::schema::Field::Reader>::Maybe
                  ((Maybe<capnp::schema::Field::Reader> *)&_kjCondition_2.result,replacement);
        checkUpgradeToStruct
                  (this,&local_328,uVar4,&local_3c0,
                   (Maybe<capnp::schema::Field::Reader> *)&_kjCondition_2.result);
        kj::Maybe<capnp::schema::Field::Reader>::~Maybe
                  ((Maybe<capnp::schema::Field::Reader> *)&_kjCondition_2.result);
        kj::Maybe<capnp::schema::Node::Reader>::~Maybe(&local_3c0);
      }
      else if (WVar3 == GROUP) {
        capnp::schema::Field::Reader::getGroup(&local_460,field);
        local_430 = capnp::schema::Field::Group::Reader::getTypeId(&local_460);
        local_428 = kj::_::DebugExpressionStart::operator<<
                              ((DebugExpressionStart *)&kj::_::MAGIC_ASSERT,&local_430);
        capnp::schema::Field::Reader::getGroup((Reader *)&f_2,replacement);
        local_468 = capnp::schema::Field::Group::Reader::getTypeId((Reader *)&f_2);
        kj::_::DebugExpression<unsigned_long>::operator==
                  ((DebugComparison<unsigned_long,_unsigned_long> *)local_420,&local_428,&local_468)
        ;
        bVar1 = kj::_::DebugComparison::operator_cast_to_bool((DebugComparison *)local_420);
        if (!bVar1) {
          kj::_::Debug::Fault::
          Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[17]>
                    (&local_4a0,
                     "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
                     ,0x34c,FAILED,
                     "field.getGroup().getTypeId() == replacement.getGroup().getTypeId()",
                     "_kjCondition,\"group id changed\"",
                     (DebugComparison<unsigned_long,_unsigned_long> *)local_420,
                     (char (*) [17])"group id changed");
          this->compatibility = INCOMPATIBLE;
          kj::_::Debug::Fault::~Fault(&local_4a0);
        }
      }
    }
  }
  else {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int&,unsigned_int&>&,char_const(&)[28]>
              (&local_c8,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x328,FAILED,"discriminant == replacementDiscriminant",
               "_kjCondition,\"Field discriminant changed.\"",
               (DebugComparison<unsigned_int_&,_unsigned_int_&> *)local_b8,
               (char (*) [28])"Field discriminant changed.");
    this->compatibility = INCOMPATIBLE;
    kj::_::Debug::Fault::~Fault(&local_c8);
  }
  kj::_::Debug::
  ContextImpl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++:801:5)>
  ::~ContextImpl((ContextImpl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_schema_loader_c__:801:5)>
                  *)local_78);
  return;
}

Assistant:

void checkCompatibility(const schema::Field::Reader& field,
                          const schema::Field::Reader& replacement) {
    KJ_CONTEXT("comparing struct field", field.getName());

    // A field that is initially not in a union can be upgraded to be in one, as long as it has
    // discriminant 0.
    uint discriminant = hasDiscriminantValue(field) ? field.getDiscriminantValue() : 0;
    uint replacementDiscriminant =
        hasDiscriminantValue(replacement) ? replacement.getDiscriminantValue() : 0;
    VALIDATE_SCHEMA(discriminant == replacementDiscriminant, "Field discriminant changed.");

    switch (field.which()) {
      case schema::Field::SLOT: {
        auto slot = field.getSlot();

        switch (replacement.which()) {
          case schema::Field::SLOT: {
            auto replacementSlot = replacement.getSlot();

            checkCompatibility(slot.getType(), replacementSlot.getType(),
                               NO_UPGRADE_TO_STRUCT);
            checkDefaultCompatibility(slot.getDefaultValue(),
                                      replacementSlot.getDefaultValue());

            VALIDATE_SCHEMA(slot.getOffset() == replacementSlot.getOffset(),
                            "field position changed");
            break;
          }
          case schema::Field::GROUP:
            checkUpgradeToStruct(slot.getType(), replacement.getGroup().getTypeId(),
                                 existingNode, field);
            break;
        }

        break;
      }

      case schema::Field::GROUP:
        switch (replacement.which()) {
          case schema::Field::SLOT:
            checkUpgradeToStruct(replacement.getSlot().getType(), field.getGroup().getTypeId(),
                                 replacementNode, replacement);
            break;
          case schema::Field::GROUP:
            VALIDATE_SCHEMA(field.getGroup().getTypeId() == replacement.getGroup().getTypeId(),
                            "group id changed");
            break;
        }
        break;
    }
  }